

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O3

_Bool check_mat_mul(ggml_tensor *y,ggml_tensor *x0,ggml_tensor *x1)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  int64_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  size_t nb0_1;
  ulong uVar11;
  long lVar12;
  uint *puVar13;
  uint *puVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  
  lVar1 = x0->ne[0];
  lVar17 = x0->ne[1];
  lVar2 = x1->ne[0];
  lVar3 = x1->ne[1];
  iVar4 = x1->ne[2];
  iVar5 = x1->ne[3];
  uVar6 = y->ne[0];
  uVar7 = y->ne[1];
  uVar8 = y->ne[2];
  uVar9 = y->ne[3];
  printf("x0: [%ld, %ld, %ld, %ld]\n",lVar1,lVar17,x0->ne[2],x0->ne[3]);
  if (0 < lVar17) {
    lVar12 = 0;
    do {
      if (0 < lVar1) {
        lVar15 = 0;
        do {
          printf("%6.3f ",(double)*(float *)((long)x0->data +
                                            x0->nb[1] * lVar12 + x0->nb[0] * lVar15));
          lVar15 = lVar15 + 1;
        } while (lVar1 != lVar15);
      }
      putchar(10);
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar17);
  }
  putchar(10);
  printf("x1: [%ld, %ld, %ld, %ld]\n",lVar2,lVar3,iVar4,iVar5);
  if (0 < lVar3) {
    lVar17 = 0;
    do {
      if (0 < lVar2) {
        lVar12 = 0;
        do {
          printf("%6.3f ",(double)*(float *)((long)x1->data +
                                            x1->nb[1] * lVar17 + x1->nb[0] * lVar12));
          lVar12 = lVar12 + 1;
        } while (lVar2 != lVar12);
      }
      putchar(10);
      lVar17 = lVar17 + 1;
    } while (lVar17 != lVar3);
  }
  putchar(10);
  printf("y: [%ld, %ld, %ld, %ld]\n",uVar6,uVar7,uVar8,uVar9);
  if (0 < (long)uVar7) {
    uVar11 = 0;
    do {
      if (0 < (long)uVar6) {
        uVar18 = 0;
        do {
          printf("%6.3f ",(double)*(float *)((long)y->data + y->nb[1] * uVar11 + y->nb[0] * uVar18))
          ;
          uVar18 = uVar18 + 1;
        } while (uVar6 != uVar18);
      }
      putchar(10);
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar7);
  }
  if (0 < (long)uVar9) {
    uVar11 = 0;
    auVar21._8_4_ = 0x7fffffff;
    auVar21._0_8_ = 0x7fffffff7fffffff;
    auVar21._12_4_ = 0x7fffffff;
    do {
      if (0 < (long)uVar8) {
        uVar18 = 0;
        do {
          if (0 < (long)uVar7) {
            uVar19 = 0;
            do {
              if (0 < (long)uVar6) {
                uVar16 = 0;
                do {
                  if (lVar1 < 1) {
                    auVar22 = ZEXT864(0);
                  }
                  else {
                    puVar14 = (uint *)(x1->nb[1] * uVar19 + x1->nb[2] * uVar18 + x1->nb[3] * uVar11
                                      + (long)x1->data);
                    puVar13 = (uint *)(x0->nb[1] * uVar16 + x0->nb[2] * uVar18 + x0->nb[3] * uVar11
                                      + (long)x0->data);
                    auVar22 = ZEXT864(0);
                    lVar17 = lVar1;
                    do {
                      auVar10 = vfmadd231ss_fma(auVar22._0_16_,ZEXT416(*puVar13),ZEXT416(*puVar14));
                      auVar22 = ZEXT1664(auVar10);
                      puVar14 = (uint *)((long)puVar14 + x1->nb[0]);
                      puVar13 = (uint *)((long)puVar13 + x0->nb[0]);
                      lVar17 = lVar17 + -1;
                    } while (lVar17 != 0);
                  }
                  auVar10 = vandps_avx(ZEXT416((uint)(auVar22._0_4_ -
                                                     *(float *)((long)y->data +
                                                               y->nb[0] * uVar16 +
                                                               y->nb[3] * uVar11 + y->nb[2] * uVar18
                                                               + y->nb[1] * uVar19))),auVar21);
                  if (1e-05 < auVar10._0_4_) {
                    fVar20 = mat_get(y,(int)uVar16,(int)uVar19,(int)uVar18,(int)uVar11);
                    printf("error: i0=%d, i1=%d, i2=%d, i3=%d, sum=%f, y=%f\n",(double)auVar22._0_4_
                           ,(double)fVar20,uVar16 & 0xffffffff,uVar19 & 0xffffffff,
                           uVar18 & 0xffffffff,uVar11 & 0xffffffff);
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                                  ,0xdc,
                                  "_Bool check_mat_mul(const struct ggml_tensor *, const struct ggml_tensor *, const struct ggml_tensor *)"
                                 );
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar16 != uVar6);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar7);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar8);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar9);
  }
  return true;
}

Assistant:

bool check_mat_mul(
        const struct ggml_tensor * y,
        const struct ggml_tensor * x0,
        const struct ggml_tensor * x1) {
    const int64_t n00 = x0->ne[0];
    const int64_t n10 = x0->ne[1];
    const int64_t n20 = x0->ne[2];
    const int64_t n30 = x0->ne[3];

    const int64_t n01 = x1->ne[0];
    const int64_t n11 = x1->ne[1];
    const int64_t n21 = x1->ne[2];
    const int64_t n31 = x1->ne[3];

    const int64_t n02 = y->ne[0];
    const int64_t n12 = y->ne[1];
    const int64_t n22 = y->ne[2];
    const int64_t n32 = y->ne[3];

    printf("x0: [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n", n00, n10, n20, n30);
    for (int j = 0; j < n10; ++j) {
        for (int i = 0; i < n00; ++i) {
            printf("%6.3f ", mat_get(x0, i, j, 0, 0));
        }
        printf("\n");
    }
    printf("\n");

    printf("x1: [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n", n01, n11, n21, n31);
    for (int j = 0; j < n11; ++j) {
        for (int i = 0; i < n01; ++i) {
            printf("%6.3f ", mat_get(x1, i, j, 0, 0));
        }
        printf("\n");
    }
    printf("\n");

    printf("y: [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n", n02, n12, n22, n32);
    for (int j = 0; j < n12; ++j) {
        for (int i = 0; i < n02; ++i) {
            printf("%6.3f ", mat_get(y, i, j, 0, 0));
        }
        printf("\n");
    }

    for (int i3 = 0; i3 < n32; ++i3) {
        for (int i2 = 0; i2 < n22; ++i2) {
            for (int i1 = 0; i1 < n12; ++i1) {
                for (int i0 = 0; i0 < n02; ++i0) {
                    float sum = 0.0f;
                    for (int k = 0; k < n00; ++k) {
                        sum += mat_get(x0, k, i0, i2, i3) * mat_get(x1, k, i1, i2, i3);
                    }
                    if (fabsf(sum - mat_get(y, i0, i1, i2, i3)) > 1e-5) {
                        printf("error: i0=%d, i1=%d, i2=%d, i3=%d, sum=%f, y=%f\n",
                                i0, i1, i2, i3, sum, mat_get(y, i0, i1, i2, i3));
                        assert(false);
                        return false;
                    }
                }
            }
        }
    }

    return true;
}